

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS0::setCompassCTRL5(RTIMULSM9DS0 *this)

{
  uchar ctrl5;
  RTIMULSM9DS0 *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_LSM9DS0CompassSampleRate < 0) ||
     (5 < ((this->super_RTIMU).m_settings)->m_LSM9DS0CompassSampleRate)) {
    fprintf(_stderr,"Illegal LSM9DS0 compass sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS0CompassSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelCompassSlaveAddr,'$',
                            (uchar)(((this->super_RTIMU).m_settings)->m_LSM9DS0CompassSampleRate <<
                                   2),"Failed to set LSM9DS0 compass CTRL5");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS0::setCompassCTRL5()
{
    unsigned char ctrl5;

    if ((m_settings->m_LSM9DS0CompassSampleRate < 0) || (m_settings->m_LSM9DS0CompassSampleRate > 5)) {
        HAL_ERROR1("Illegal LSM9DS0 compass sample rate code %d\n", m_settings->m_LSM9DS0CompassSampleRate);
        return false;
    }

    ctrl5 = (m_settings->m_LSM9DS0CompassSampleRate << 2);

#ifdef LSM9DS0_CACHE_MODE
    //  enable fifo

    ctrl5 |= 0x40;
#endif

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM9DS0_CTRL5, ctrl5, "Failed to set LSM9DS0 compass CTRL5");
}